

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wrapper.cpp
# Opt level: O1

UniquePtr<SDL_Surface> * __thiscall
solitaire::SDL::Wrapper::loadBMP
          (UniquePtr<SDL_Surface> *__return_storage_ptr__,Wrapper *this,string *file)

{
  undefined8 uVar1;
  SDL_Surface *pSVar2;
  
  uVar1 = SDL_RWFromFile((file->_M_dataplus)._M_p,"rb");
  pSVar2 = (SDL_Surface *)SDL_LoadBMP_RW(uVar1,1);
  *(undefined8 *)
   &(__return_storage_ptr__->_M_t).
    super___uniq_ptr_impl<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>._M_t.
    super__Tuple_impl<0UL,_SDL_Surface_*,_std::function<void_(SDL_Surface_*)>_>.
    super__Tuple_impl<1UL,_std::function<void_(SDL_Surface_*)>_>.
    super__Head_base<1UL,_std::function<void_(SDL_Surface_*)>,_false>._M_head_impl = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->_M_t).
           super___uniq_ptr_impl<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>._M_t.
           super__Tuple_impl<0UL,_SDL_Surface_*,_std::function<void_(SDL_Surface_*)>_>.
           super__Tuple_impl<1UL,_std::function<void_(SDL_Surface_*)>_>.
           super__Head_base<1UL,_std::function<void_(SDL_Surface_*)>,_false>._M_head_impl + 8) = 0;
  *(code **)((long)&(__return_storage_ptr__->_M_t).
                    super___uniq_ptr_impl<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>._M_t.
                    super__Tuple_impl<0UL,_SDL_Surface_*,_std::function<void_(SDL_Surface_*)>_>.
                    super__Tuple_impl<1UL,_std::function<void_(SDL_Surface_*)>_>.
                    super__Head_base<1UL,_std::function<void_(SDL_Surface_*)>,_false>._M_head_impl +
            0x18) =
       std::_Function_handler<void_(SDL_Surface_*),_solitaire::SDL::PtrDeleter>::_M_invoke;
  *(code **)((long)&(__return_storage_ptr__->_M_t).
                    super___uniq_ptr_impl<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>._M_t.
                    super__Tuple_impl<0UL,_SDL_Surface_*,_std::function<void_(SDL_Surface_*)>_>.
                    super__Tuple_impl<1UL,_std::function<void_(SDL_Surface_*)>_>.
                    super__Head_base<1UL,_std::function<void_(SDL_Surface_*)>,_false>._M_head_impl +
            0x10) =
       std::_Function_handler<void_(SDL_Surface_*),_solitaire::SDL::PtrDeleter>::_M_manager;
  (__return_storage_ptr__->_M_t).
  super___uniq_ptr_impl<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>._M_t.
  super__Tuple_impl<0UL,_SDL_Surface_*,_std::function<void_(SDL_Surface_*)>_>.
  super__Head_base<0UL,_SDL_Surface_*,_false>._M_head_impl = pSVar2;
  return __return_storage_ptr__;
}

Assistant:

UniquePtr<SDL_Surface> Wrapper::loadBMP(const std::string& file) const {
    return UniquePtr<SDL_Surface> {SDL_LoadBMP(file.c_str()), PtrDeleter {}};
}